

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O1

int __thiscall
zmq::ip_resolver_t::resolve_nic_name(ip_resolver_t *this,ip_addr_t *ip_addr_,char *nic_)

{
  short sVar1;
  uint uVar2;
  short *__src;
  bool bVar3;
  int iVar4;
  int *piVar5;
  uint *puVar6;
  size_t __n;
  bool bVar7;
  int i;
  int iVar8;
  long *plVar9;
  ifaddrs *ifa;
  long *local_48;
  ip_addr_t *local_40;
  char *local_38;
  
  local_48 = (long *)0x0;
  iVar8 = 0;
  local_40 = ip_addr_;
  local_38 = nic_;
  do {
    iVar4 = getifaddrs(&local_48);
    if (iVar4 == 0) goto LAB_001eb6ed;
    if ((iVar4 < 0) && (piVar5 = __errno_location(), *piVar5 != 0x6f)) break;
    usleep(1000 << ((byte)iVar8 & 0x1f));
    iVar8 = iVar8 + 1;
  } while (iVar8 != 10);
  if (iVar4 != 0) {
    puVar6 = (uint *)__errno_location();
    uVar2 = *puVar6;
    if ((uVar2 == 0x16) || (uVar2 == 0x5f)) goto LAB_001eb7a7;
    resolve_nic_name((ip_resolver_t *)(ulong)uVar2);
  }
LAB_001eb6ed:
  if (local_48 == (long *)0x0) {
    resolve_nic_name();
  }
  if (local_48 == (long *)0x0) {
    freeifaddrs(0);
  }
  else {
    bVar7 = false;
    plVar9 = local_48;
    do {
      __src = (short *)plVar9[3];
      if (__src != (short *)0x0) {
        sVar1 = *__src;
        bVar3 = true;
        if (((ushort)((ushort)(this->_options)._ipv6_wanted * 8 + 2) == sVar1) &&
           (iVar8 = strcmp(local_38,(char *)plVar9[1]), iVar8 == 0)) {
          __n = 0x10;
          if (sVar1 != 2) {
            __n = 0x1c;
          }
          memcpy(local_40,__src,__n);
          bVar7 = true;
          bVar3 = false;
        }
        if (!bVar3) break;
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
    freeifaddrs(local_48);
    if (bVar7) {
      return 0;
    }
  }
  puVar6 = (uint *)__errno_location();
LAB_001eb7a7:
  *puVar6 = 0x13;
  return -1;
}

Assistant:

int zmq::ip_resolver_t::resolve_nic_name (ip_addr_t *ip_addr_, const char *nic_)
{
    //  Get the addresses.
    ifaddrs *ifa = NULL;
    int rc = 0;
    const int max_attempts = 10;
    const int backoff_msec = 1;
    for (int i = 0; i < max_attempts; i++) {
        rc = getifaddrs (&ifa);
        if (rc == 0 || (rc < 0 && errno != ECONNREFUSED))
            break;
        usleep ((backoff_msec << i) * 1000);
    }

    if (rc != 0 && ((errno == EINVAL) || (errno == EOPNOTSUPP))) {
        // Windows Subsystem for Linux compatibility
        errno = ENODEV;
        return -1;
    }
    errno_assert (rc == 0);
    zmq_assert (ifa != NULL);

    //  Find the corresponding network interface.
    bool found = false;
    for (const ifaddrs *ifp = ifa; ifp != NULL; ifp = ifp->ifa_next) {
        if (ifp->ifa_addr == NULL)
            continue;

        const int family = ifp->ifa_addr->sa_family;
        if (family == (_options.ipv6 () ? AF_INET6 : AF_INET)
            && !strcmp (nic_, ifp->ifa_name)) {
            memcpy (ip_addr_, ifp->ifa_addr,
                    (family == AF_INET) ? sizeof (struct sockaddr_in)
                                        : sizeof (struct sockaddr_in6));
            found = true;
            break;
        }
    }

    //  Clean-up;
    freeifaddrs (ifa);

    if (!found) {
        errno = ENODEV;
        return -1;
    }
    return 0;
}